

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

string * __thiscall
cxxopts::values::abstract_value<std::vector<float,std::allocator<float>>>::
get_implicit_value_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)((long)this + 0x58),
             *(long *)((long)this + 0x60) + *(long *)((long)this + 0x58));
  return __return_storage_ptr__;
}

Assistant:

std::string
      get_implicit_value() const override
      {
        return m_implicit_value;
      }